

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O2

HT_ErrorCode ht_stack_push(HT_Stack *stack,void *data,size_t size)

{
  HT_Boolean HVar1;
  HT_ErrorCode HVar2;
  size_t new_capacity;
  long lVar3;
  void *data_00;
  
  data_00 = (void *)stack->size;
  if (stack->capacity - (long)data_00 < size) {
    lVar3 = 2;
    do {
      new_capacity = lVar3 * stack->capacity;
      lVar3 = lVar3 * 2;
    } while (new_capacity - (long)data_00 < size);
    HVar1 = _ht_stack_resize(stack,new_capacity);
    if (HVar1 == 0) {
      return HT_ERR_OUT_OF_MEMORY;
    }
    data_00 = (void *)stack->size;
  }
  HVar2 = ht_bag_void_ptr_add(&stack->sizes_stack,data_00);
  if (HVar2 == HT_ERR_OK) {
    memcpy((void *)((long)stack->data + stack->size),data,size);
    stack->size = stack->size + size;
    HVar2 = HT_ERR_OK;
  }
  return HVar2;
}

Assistant:

HT_ErrorCode
ht_stack_push(HT_Stack* stack, void* data, size_t size)
{
    HT_ErrorCode bag_err_code = HT_ERR_OK;

    if (stack->capacity - stack->size < size)
    {
        size_t factor = 2;
        while (stack->capacity * factor - stack->size < size)
        {
            factor *= 2;
        }
        if (!_ht_stack_resize(stack, stack->capacity * factor))
        {
            return HT_ERR_OUT_OF_MEMORY;
        }
    }

    bag_err_code = ht_bag_void_ptr_add(&stack->sizes_stack, (void*)stack->size);
    if (bag_err_code != HT_ERR_OK)
    {
        return bag_err_code;
    }

    memcpy(HT_PTR_ADD(stack->data, stack->size), data, size);
    stack->size += size;

    return HT_ERR_OK;
}